

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int handle_certificate(ptls_t *tls,uint8_t *src,uint8_t *end,int *got_certs)

{
  byte bVar1;
  st_ptls_on_extension_t *psVar2;
  st_ptls_verify_certificate_t *psVar3;
  ushort extid;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  char **ppcVar8;
  long lVar9;
  char *pcVar10;
  ushort *puVar11;
  ulong uVar12;
  ushort *puVar13;
  ushort *puVar14;
  bool bVar15;
  ptls_iovec_t pVar16;
  st_ptls_extension_bitmap_t bitmap;
  ptls_iovec_t certs [16];
  st_ptls_extension_bitmap_t local_140;
  ptls_iovec_t local_138 [16];
  
  uVar6 = 0x32;
  if (src == end) {
    uVar7 = 0;
  }
  else {
    bVar1 = *src;
    src = src + 1;
    uVar7 = 0;
    if ((ulong)bVar1 <= (ulong)((long)end - (long)src)) {
      uVar6 = 0x2f;
      if (bVar1 == 0) {
        uVar6 = uVar7;
      }
      uVar7 = (uint)(bVar1 == 0);
    }
  }
  if ((char)uVar7 == '\0') {
    return uVar6;
  }
  uVar7 = 0x32;
  if (2 < (ulong)((long)end - (long)src)) {
    lVar9 = 0;
    uVar12 = 0;
    do {
      uVar12 = (ulong)*(byte *)((long)src + lVar9) | uVar12 << 8;
      lVar9 = lVar9 + 1;
    } while (lVar9 != 3);
    src = (uint8_t *)((long)src + 3);
    if (uVar12 <= (ulong)((long)end - (long)src)) {
      puVar13 = (ushort *)(uVar12 + (long)src);
      uVar12 = 0;
      uVar7 = uVar6;
      do {
        if ((ushort *)src == puVar13) {
          iVar5 = 0;
          break;
        }
        iVar5 = 4;
        puVar14 = (ushort *)src;
        if ((ulong)((long)puVar13 - (long)src) < 3) {
LAB_0011dd17:
          bVar15 = false;
          uVar7 = 0x32;
        }
        else {
          lVar9 = 0;
          pVar16.len = 0;
          do {
            pVar16.len = (ulong)*(byte *)((long)src + lVar9) | pVar16.len << 8;
            lVar9 = lVar9 + 1;
          } while (lVar9 != 3);
          puVar11 = (ushort *)((long)src + 3);
          puVar14 = puVar11;
          if ((ulong)((long)puVar13 - (long)puVar11) < pVar16.len) goto LAB_0011dd17;
          puVar14 = (ushort *)((long)puVar11 + pVar16.len);
          bVar15 = true;
          if (uVar12 < 0x10) {
            local_138[uVar12].base = (uint8_t *)puVar11;
            local_138[uVar12].len = pVar16.len;
            iVar5 = 0;
            uVar12 = uVar12 + 1;
          }
          else {
            iVar5 = 0;
          }
        }
        src = (uint8_t *)puVar14;
        if (!bVar15) break;
        local_140.bits = 0;
        iVar5 = 4;
        uVar6 = 0x32;
        if (1 < (ulong)((long)puVar13 - (long)puVar14)) {
          lVar9 = 0;
          pVar16.len = 0;
          do {
            pVar16.len = (ulong)*(byte *)((long)puVar14 + lVar9) | pVar16.len << 8;
            lVar9 = lVar9 + 1;
          } while (lVar9 != 2);
          src = (uint8_t *)(puVar14 + 1);
          if (pVar16.len <= (ulong)((long)puVar13 - (long)src)) {
            if (pVar16.len == 0) {
              iVar5 = 0;
              uVar6 = uVar7;
            }
            else {
              puVar14 = (ushort *)((long)puVar14 + pVar16.len + 2);
              puVar11 = (ushort *)src;
              do {
                src = (uint8_t *)puVar11;
                iVar5 = 4;
                uVar6 = 0x32;
                if ((long)puVar14 - (long)puVar11 < 2) goto LAB_0011ded9;
                extid = *puVar11 << 8 | *puVar11 >> 8;
                src = (uint8_t *)(puVar11 + 1);
                iVar4 = extension_bitmap_testandset(&local_140,0xb,extid);
                if (iVar4 == 0) {
                  uVar6 = 0x2f;
                  goto LAB_0011ded9;
                }
                uVar6 = 0x32;
                iVar5 = 4;
                if (1 < (ulong)((long)puVar14 - (long)src)) {
                  lVar9 = 0;
                  pVar16.len = 0;
                  do {
                    pVar16.len = (ulong)*(byte *)((long)src + lVar9) | pVar16.len << 8;
                    lVar9 = lVar9 + 1;
                  } while (lVar9 != 2);
                  src = (uint8_t *)(puVar11 + 2);
                  if (pVar16.len <= (ulong)((long)puVar14 - (long)src)) {
                    psVar2 = tls->ctx->on_extension;
                    if (psVar2 == (st_ptls_on_extension_t *)0x0) {
                      iVar5 = 0;
                      uVar6 = 0;
                      src = (uint8_t *)((long)src + pVar16.len);
                    }
                    else {
                      pVar16.base = src;
                      iVar5 = (*psVar2->cb)(psVar2,tls,'\v',extid,pVar16);
                      uVar6 = (uint)(iVar5 != 0);
                      puVar11 = (ushort *)((long)src + pVar16.len);
                      if (iVar5 != 0) {
                        puVar11 = (ushort *)src;
                      }
                      iVar5 = uVar6 * 4;
                      src = (uint8_t *)puVar11;
                    }
                  }
                }
                if (iVar5 != 0) goto LAB_0011ded9;
                puVar11 = (ushort *)src;
              } while ((ushort *)src != puVar14);
              iVar5 = 0;
            }
          }
        }
LAB_0011ded9:
        uVar7 = uVar6;
      } while (iVar5 == 0);
      bVar15 = iVar5 == 0;
      goto LAB_0011def5;
    }
  }
  bVar15 = false;
  uVar12 = 0;
LAB_0011def5:
  uVar6 = uVar7;
  if ((bVar15) && (uVar6 = 0x32, src == end)) {
    psVar3 = tls->ctx->verify_certificate;
    uVar6 = uVar7;
    if (psVar3 != (st_ptls_verify_certificate_t *)0x0) {
      if ((tls->field_0x1e8 & 1) == 0) {
        ppcVar8 = &tls->server_name;
        if ((undefined1  [112])((undefined1  [112])tls->ech & (undefined1  [112])0x5) ==
            (undefined1  [112])0x1) {
          ppcVar8 = &(tls->ech).client.public_name;
        }
        pcVar10 = *ppcVar8;
      }
      else {
        pcVar10 = (char *)0x0;
      }
      uVar6 = (*psVar3->cb)(psVar3,tls,pcVar10,&(tls->certificate_verify).cb,
                            &(tls->certificate_verify).verify_ctx,local_138,uVar12);
      if (uVar6 != 0) {
        return uVar6;
      }
    }
    *got_certs = (uint)(uVar12 != 0);
  }
  return uVar6;
}

Assistant:

static int handle_certificate(ptls_t *tls, const uint8_t *src, const uint8_t *end, int *got_certs)
{
    ptls_iovec_t certs[16];
    size_t num_certs = 0;
    int ret = 0;

    /* certificate request context */
    ptls_decode_open_block(src, end, 1, {
        if (src != end) {
            ret = PTLS_ALERT_ILLEGAL_PARAMETER;
            goto Exit;
        }
    });
    /* certificate_list */
    ptls_decode_block(src, end, 3, {
        while (src != end) {
            ptls_decode_open_block(src, end, 3, {
                if (num_certs < PTLS_ELEMENTSOF(certs))
                    certs[num_certs++] = ptls_iovec_init(src, end - src);
                src = end;
            });
            uint16_t type;
            decode_open_extensions(src, end, PTLS_HANDSHAKE_TYPE_CERTIFICATE, &type, {
                if (tls->ctx->on_extension != NULL &&
                    (ret = tls->ctx->on_extension->cb(tls->ctx->on_extension, tls, PTLS_HANDSHAKE_TYPE_CERTIFICATE, type,
                                                      ptls_iovec_init(src, end - src)) != 0))
                    goto Exit;
                src = end;
            });
        }
    });

    if (tls->ctx->verify_certificate != NULL) {
        const char *server_name = NULL;
        if (!ptls_is_server(tls)) {
            if (tls->ech.offered && !ptls_is_ech_handshake(tls, NULL, NULL, NULL)) {
                server_name = tls->ech.client.public_name;
            } else {
                server_name = tls->server_name;
            }
        }
        if ((ret = tls->ctx->verify_certificate->cb(tls->ctx->verify_certificate, tls, server_name, &tls->certificate_verify.cb,
                                                    &tls->certificate_verify.verify_ctx, certs, num_certs)) != 0)
            goto Exit;
    }

    *got_certs = num_certs != 0;

Exit:
    return ret;
}